

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall fasttext::FastText::train(FastText *this,Args *args)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  undefined8 uVar3;
  Args *pAVar4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  char cVar6;
  int iVar7;
  invalid_argument *piVar8;
  bool normalizeGradient;
  shared_ptr<fasttext::Loss> loss;
  ifstream ifs;
  bool local_25a;
  undefined1 local_259;
  undefined1 local_258 [48];
  Args *local_228;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_220 [65];
  
  local_228 = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Args,std::allocator<fasttext::Args>,fasttext::Args_const&>
            (a_Stack_220,&local_228,(allocator<fasttext::Args> *)local_258,args);
  _Var5._M_pi = a_Stack_220[0]._M_pi;
  pAVar4 = local_228;
  local_228 = (Args *)0x0;
  a_Stack_220[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr = pAVar4;
  (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_220[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_220[0]._M_pi);
  }
  local_228 = (Args *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<fasttext::Dictionary,std::allocator<fasttext::Dictionary>,std::shared_ptr<fasttext::Args>&>
            (a_Stack_220,(Dictionary **)&local_228,(allocator<fasttext::Dictionary> *)local_258,
             &this->args_);
  _Var5._M_pi = a_Stack_220[0]._M_pi;
  pAVar4 = local_228;
  local_228 = (Args *)0x0;
  a_Stack_220[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)pAVar4;
  (this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = _Var5._M_pi;
  if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
  }
  if (a_Stack_220[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_220[0]._M_pi);
  }
  iVar7 = std::__cxx11::string::compare
                    ((char *)(this->args_).
                             super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if (iVar7 != 0) {
    std::ifstream::ifstream
              (&local_228,
               (string *)
               (this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               _S_in);
    cVar6 = std::__basic_file<char>::is_open();
    if (cVar6 != '\0') {
      Dictionary::readFromFile
                ((this->dict_).super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,(istream *)&local_228);
      std::ifstream::close();
      if ((((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          pretrainedVectors)._M_string_length == 0) {
        createRandomMatrix((FastText *)local_258);
      }
      else {
        getInputMatrixFromFile((FastText *)local_258,(string *)this);
      }
      uVar3 = local_258._8_8_;
      uVar2 = local_258._0_8_;
      local_258._0_8_ = (element_type *)0x0;
      local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar2;
      (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
      }
      createTrainOutputMatrix((FastText *)local_258);
      uVar3 = local_258._8_8_;
      uVar2 = local_258._0_8_;
      local_258._0_8_ = (element_type *)0x0;
      local_258._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar2;
      (this->output_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
      }
      createLoss((FastText *)local_258,(shared_ptr<fasttext::Matrix> *)this);
      local_25a = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr)->model == sup;
      local_258._32_8_ = (element_type *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<fasttext::Model,std::allocator<fasttext::Model>,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Matrix>&,std::shared_ptr<fasttext::Loss>&,bool&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_258 + 0x28),
                 (Model **)(local_258 + 0x20),(allocator<fasttext::Model> *)&local_259,&this->input_
                 ,&this->output_,(shared_ptr<fasttext::Loss> *)local_258,&local_25a);
      uVar3 = local_258._40_8_;
      uVar2 = local_258._32_8_;
      local_258._32_8_ = (element_type *)0x0;
      local_258._40_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar2;
      (this->model_).super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar3;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._40_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._40_8_);
      }
      startThreads(this);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_258._8_8_);
      }
      std::ifstream::~ifstream(&local_228);
      return;
    }
    piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                   &((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr)->input," cannot be opened for training!");
    std::invalid_argument::invalid_argument(piVar8,(string *)local_258);
    __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  piVar8 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(piVar8,"Cannot use stdin for training!");
  __cxa_throw(piVar8,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void FastText::train(const Args& args) {
  args_ = std::make_shared<Args>(args);
  dict_ = std::make_shared<Dictionary>(args_);
  if (args_->input == "-") {
    // manage expectations
    throw std::invalid_argument("Cannot use stdin for training!");
  }
  std::ifstream ifs(args_->input);
  if (!ifs.is_open()) {
    throw std::invalid_argument(
        args_->input + " cannot be opened for training!");
  }
  dict_->readFromFile(ifs);
  ifs.close();

  if (!args_->pretrainedVectors.empty()) {
    input_ = getInputMatrixFromFile(args_->pretrainedVectors);
  } else {
    input_ = createRandomMatrix();
  }
  output_ = createTrainOutputMatrix();
  auto loss = createLoss(output_);
  bool normalizeGradient = (args_->model == model_name::sup);
  model_ = std::make_shared<Model>(input_, output_, loss, normalizeGradient);
  startThreads();
}